

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeUnbind(Vdbe *p,uint i)

{
  sqlite3_mutex *psVar1;
  Mem *pMVar2;
  sqlite3 *db;
  int iVar3;
  uint uVar4;
  
  iVar3 = vdbeSafetyNotNull(p);
  if (iVar3 == 0) {
    psVar1 = p->db->mutex;
    if (psVar1 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar1);
    }
    if (p->eVdbeState == '\x01') {
      if (i < (uint)(int)p->nVar) {
        pMVar2 = p->aVar;
        sqlite3VdbeMemRelease(pMVar2 + i);
        pMVar2[i].flags = 1;
        p->db->errCode = 0;
        iVar3 = 0;
        if (p->expmask != 0) {
          uVar4 = 0x80000000;
          if (i < 0x1f) {
            uVar4 = 1 << ((byte)i & 0x1f);
          }
          if ((p->expmask & uVar4) != 0) {
            *(ushort *)&p->field_0xc8 = ((ushort)*(undefined4 *)&p->field_0xc8 & 0xfffc) + 1;
            iVar3 = 0;
          }
        }
      }
      else {
        iVar3 = 0x19;
        sqlite3Error(p->db,0x19);
        psVar1 = p->db->mutex;
        if (psVar1 != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(psVar1);
        }
      }
      return iVar3;
    }
    db = p->db;
    iVar3 = sqlite3MisuseError(0x1688e);
    sqlite3Error(db,iVar3);
    psVar1 = p->db->mutex;
    if (psVar1 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar1);
    }
    sqlite3_log(0x15,"bind on a busy prepared statement: [%s]",p->zSql);
    iVar3 = 0x16892;
  }
  else {
    iVar3 = 0x1688a;
  }
  iVar3 = sqlite3MisuseError(iVar3);
  return iVar3;
}

Assistant:

static int vdbeUnbind(Vdbe *p, unsigned int i){
  Mem *pVar;
  if( vdbeSafetyNotNull(p) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(p->db->mutex);
  if( p->eVdbeState!=VDBE_READY_STATE ){
    sqlite3Error(p->db, SQLITE_MISUSE_BKPT);
    sqlite3_mutex_leave(p->db->mutex);
    sqlite3_log(SQLITE_MISUSE,
        "bind on a busy prepared statement: [%s]", p->zSql);
    return SQLITE_MISUSE_BKPT;
  }
  if( i>=(unsigned int)p->nVar ){
    sqlite3Error(p->db, SQLITE_RANGE);
    sqlite3_mutex_leave(p->db->mutex);
    return SQLITE_RANGE;
  }
  pVar = &p->aVar[i];
  sqlite3VdbeMemRelease(pVar);
  pVar->flags = MEM_Null;
  p->db->errCode = SQLITE_OK;

  /* If the bit corresponding to this variable in Vdbe.expmask is set, then
  ** binding a new value to this variable invalidates the current query plan.
  **
  ** IMPLEMENTATION-OF: R-57496-20354 If the specific value bound to a host
  ** parameter in the WHERE clause might influence the choice of query plan
  ** for a statement, then the statement will be automatically recompiled,
  ** as if there had been a schema change, on the first sqlite3_step() call
  ** following any change to the bindings of that parameter.
  */
  assert( (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 || p->expmask==0 );
  if( p->expmask!=0 && (p->expmask & (i>=31 ? 0x80000000 : (u32)1<<i))!=0 ){
    p->expired = 1;
  }
  return SQLITE_OK;
}